

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::alloc
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,int new_len)

{
  CSkin *pCVar1;
  undefined1 auVar2 [16];
  int iVar3;
  CSkin *pCVar4;
  ulong uVar5;
  long lVar6;
  
  this->list_size = new_len;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)new_len;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(200),8) == 0) {
    uVar5 = SUB168(auVar2 * ZEXT816(200),0);
  }
  pCVar4 = (CSkin *)operator_new__(uVar5);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  if (0 < new_len) {
    pCVar1 = this->list;
    lVar6 = 0;
    do {
      memcpy(pCVar4->m_aName + lVar6 + -4,pCVar1->m_aName + lVar6 + -4,200);
      lVar6 = lVar6 + 200;
    } while ((ulong)(uint)new_len * 200 - lVar6 != 0);
  }
  if (this->list != (CSkin *)0x0) {
    operator_delete__(this->list);
  }
  iVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar3 = this->num_elements;
  }
  this->num_elements = iVar3;
  this->list = pCVar4;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}